

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_cache_server.cpp
# Opt level: O0

void __thiscall
cppcms::impl::tcp_cache_service::server::server
          (server *this,
          vector<std::shared_ptr<booster::aio::io_service>,_std::allocator<std::shared_ptr<booster::aio::io_service>_>_>
          *io,string *ip,int port,intrusive_ptr<cppcms::impl::base_cache> *c,
          shared_ptr<cppcms::sessions::session_storage_factory> *f)

{
  undefined4 uVar1;
  element_type *peVar2;
  size_type sVar3;
  __shared_ptr<booster::aio::io_service,_(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar4;
  reference ppiVar5;
  int in_ECX;
  string *in_RDX;
  vector<std::shared_ptr<booster::aio::io_service>,_std::allocator<std::shared_ptr<booster::aio::io_service>_>_>
  *in_RSI;
  acceptor *in_RDI;
  acceptor *paVar6;
  endpoint ep;
  size_t i;
  shared_ptr<cppcms::sessions::session_storage_factory> *in_stack_ffffffffffffff48;
  __shared_ptr_access<booster::aio::io_service,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffff50;
  size_type in_stack_ffffffffffffff68;
  ulong uVar7;
  endpoint local_50 [8];
  ulong local_48;
  undefined4 in_stack_ffffffffffffffe0;
  
  std::
  vector<std::shared_ptr<booster::aio::io_service>,_std::allocator<std::shared_ptr<booster::aio::io_service>_>_>
  ::operator[](in_RSI,0);
  peVar2 = std::
           __shared_ptr_access<booster::aio::io_service,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*(in_stack_ffffffffffffff50);
  booster::aio::acceptor::acceptor(in_RDI,peVar2);
  *(undefined8 *)(in_RDI + 0x30) = 0;
  booster::intrusive_ptr<cppcms::impl::base_cache>::intrusive_ptr
            ((intrusive_ptr<cppcms::impl::base_cache> *)in_stack_ffffffffffffff50,
             (intrusive_ptr<cppcms::impl::base_cache> *)in_stack_ffffffffffffff48);
  std::vector<booster::aio::io_service_*,_std::allocator<booster::aio::io_service_*>_>::vector
            ((vector<booster::aio::io_service_*,_std::allocator<booster::aio::io_service_*>_> *)
             0x481c52);
  paVar6 = in_RDI + 0x58;
  std::shared_ptr<cppcms::sessions::session_storage_factory>::shared_ptr
            ((shared_ptr<cppcms::sessions::session_storage_factory> *)in_stack_ffffffffffffff50,
             in_stack_ffffffffffffff48);
  std::
  vector<std::shared_ptr<booster::aio::io_service>,_std::allocator<std::shared_ptr<booster::aio::io_service>_>_>
  ::size(in_RSI);
  std::vector<booster::aio::io_service_*,_std::allocator<booster::aio::io_service_*>_>::resize
            ((vector<booster::aio::io_service_*,_std::allocator<booster::aio::io_service_*>_> *)
             paVar6,in_stack_ffffffffffffff68);
  local_48 = 0;
  while( true ) {
    uVar7 = local_48;
    sVar3 = std::
            vector<std::shared_ptr<booster::aio::io_service>,_std::allocator<std::shared_ptr<booster::aio::io_service>_>_>
            ::size(in_RSI);
    if (sVar3 <= uVar7) break;
    this_00 = &std::
               vector<std::shared_ptr<booster::aio::io_service>,_std::allocator<std::shared_ptr<booster::aio::io_service>_>_>
               ::operator[](in_RSI,local_48)->
               super___shared_ptr<booster::aio::io_service,_(__gnu_cxx::_Lock_policy)2>;
    peVar4 = std::__shared_ptr<booster::aio::io_service,_(__gnu_cxx::_Lock_policy)2>::get(this_00);
    ppiVar5 = std::vector<booster::aio::io_service_*,_std::allocator<booster::aio::io_service_*>_>::
              operator[]((vector<booster::aio::io_service_*,_std::allocator<booster::aio::io_service_*>_>
                          *)(in_RDI + 0x40),local_48);
    *ppiVar5 = peVar4;
    local_48 = local_48 + 1;
  }
  booster::aio::endpoint::endpoint(local_50,in_RDX,in_ECX);
  paVar6 = in_RDI;
  uVar1 = booster::aio::endpoint::family();
  booster::aio::acceptor::open(paVar6,uVar1);
  booster::aio::basic_socket::set_option(in_RDI,2,1);
  booster::aio::acceptor::bind((endpoint *)in_RDI);
  booster::aio::acceptor::listen((int)in_RDI);
  start_accept((server *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0));
  booster::aio::endpoint::~endpoint(local_50);
  return;
}

Assistant:

server(		std::vector<booster::shared_ptr<io::io_service> > &io,
			std::string ip,
			int port,
			booster::intrusive_ptr<cppcms::impl::base_cache> c,
			booster::shared_ptr<cppcms::sessions::session_storage_factory> f
		):
		acceptor_(*io[0]),
		counter(0),
		cache_(c),
		sessions_(f)
	{
		services_.resize(io.size());
		for(size_t i=0;i<io.size();i++)
			services_[i] = io[i].get();
		io::endpoint ep(ip,port);
		acceptor_.open(ep.family());
        #ifndef CPPCMS_WIN32
		acceptor_.set_option(io::basic_socket::reuse_address,true);
        #endif
		acceptor_.bind(ep);
		acceptor_.listen(10);
		start_accept();
	}